

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPPacketBuilder::FillInSDES
          (RTCPPacketBuilder *this,RTCPCompoundPacketBuilder *rtcpcomppack,bool *full,
          bool *processedall,int *added)

{
  int iVar1;
  bool *pbVar2;
  
  *full = false;
  *processedall = false;
  *added = 0;
  pbVar2 = full;
  if ((this->doname == true) && ((this->ownsdesinfo).pname == false)) {
    iVar1 = RTCPCompoundPacketBuilder::AddSDESNormalItem
                      (rtcpcomppack,NAME,
                       (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[1].str,
                       (uint8_t)(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[1].length);
    if (iVar1 == -0x2b) goto LAB_0013060f;
    *added = *added + 1;
    (this->ownsdesinfo).pname = true;
  }
  if ((this->doemail == true) && ((this->ownsdesinfo).pemail == false)) {
    iVar1 = RTCPCompoundPacketBuilder::AddSDESNormalItem
                      (rtcpcomppack,EMAIL,
                       (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[2].str,
                       (uint8_t)(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[2].length);
    if (iVar1 == -0x2b) goto LAB_0013060f;
    *added = *added + 1;
    (this->ownsdesinfo).pemail = true;
  }
  if ((this->doloc == true) && ((this->ownsdesinfo).plocation == false)) {
    iVar1 = RTCPCompoundPacketBuilder::AddSDESNormalItem
                      (rtcpcomppack,LOC,
                       (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[4].str,
                       (uint8_t)(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[4].length);
    if (iVar1 == -0x2b) goto LAB_0013060f;
    *added = *added + 1;
    (this->ownsdesinfo).plocation = true;
  }
  if ((this->dophone == true) && ((this->ownsdesinfo).pphone == false)) {
    iVar1 = RTCPCompoundPacketBuilder::AddSDESNormalItem
                      (rtcpcomppack,PHONE,
                       (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[3].str,
                       (uint8_t)(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[3].length);
    if (iVar1 == -0x2b) goto LAB_0013060f;
    *added = *added + 1;
    (this->ownsdesinfo).pphone = true;
  }
  if ((this->dotool == true) && ((this->ownsdesinfo).ptool == false)) {
    iVar1 = RTCPCompoundPacketBuilder::AddSDESNormalItem
                      (rtcpcomppack,TOOL,
                       (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[5].str,
                       (uint8_t)(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[5].length);
    if (iVar1 == -0x2b) goto LAB_0013060f;
    *added = *added + 1;
    (this->ownsdesinfo).ptool = true;
  }
  pbVar2 = processedall;
  if (((this->donote == true) && ((this->ownsdesinfo).pnote == false)) &&
     (iVar1 = RTCPCompoundPacketBuilder::AddSDESNormalItem
                        (rtcpcomppack,NOTE,
                         (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[6].str,
                         (uint8_t)(this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[6].length),
     pbVar2 = full, iVar1 != -0x2b)) {
    *added = *added + 1;
    (this->ownsdesinfo).pnote = true;
    pbVar2 = processedall;
  }
LAB_0013060f:
  *pbVar2 = true;
  return 0;
}

Assistant:

int RTCPPacketBuilder::FillInSDES(RTCPCompoundPacketBuilder *rtcpcomppack,bool *full,bool *processedall,int *added)
{
	int status;
	uint8_t *data;
	size_t datalen;
	
	*full = false;
	*processedall = false;
	*added = 0;

	// We don't need to add a SSRC for our own data, this is still set
	// from adding the CNAME
	if (doname)
	{
		if (!ownsdesinfo.ProcessedName())
		{
			data = ownsdesinfo.GetName(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::NAME,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedName(true);
		}
	}
	if (doemail)
	{
		if (!ownsdesinfo.ProcessedEMail())
		{
			data = ownsdesinfo.GetEMail(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::EMAIL,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedEMail(true);
		}
	}
	if (doloc)
	{
		if (!ownsdesinfo.ProcessedLocation())
		{
			data = ownsdesinfo.GetLocation(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::LOC,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedLocation(true);
		}
	}
	if (dophone)
	{
		if (!ownsdesinfo.ProcessedPhone())
		{
			data = ownsdesinfo.GetPhone(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::PHONE,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedPhone(true);
		}
	}
	if (dotool)
	{
		if (!ownsdesinfo.ProcessedTool())
		{
			data = ownsdesinfo.GetTool(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::TOOL,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedTool(true);
		}
	}
	if (donote)
	{
		if (!ownsdesinfo.ProcessedNote())
		{
			data = ownsdesinfo.GetNote(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::NOTE,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedNote(true);
		}
	}

	*processedall = true;
	return 0;
}